

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O2

void __thiscall FIX::Session::setResponder(Session *this,Responder *pR)

{
  bool bVar1;
  UtcTimeStamp local_30;
  
  if (this[0x24b] == (Session)0x1) {
    SessionState::refresh((SessionState *)(this + 0x288));
  }
  std::function<FIX::UtcTimeStamp_()>::operator()
            (&local_30,(function<FIX::UtcTimeStamp_()> *)(this + 8));
  bVar1 = checkSessionTime(this,&local_30);
  if (!bVar1) {
    reset(this);
  }
  *(Responder **)(this + 0x838) = pR;
  return;
}

Assistant:

void setResponder(Responder *pR) {
    if (m_refreshOnLogon) {
      refresh();
    }
    if (!checkSessionTime(m_timestamper())) {
      reset();
    }
    m_pResponder = pR;
  }